

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int tinyexr::hufEncode(longlong *hcode,unsigned_short *in,int ni,int rlc,char *out)

{
  ushort uVar1;
  int runCount;
  long lVar2;
  int lc;
  char *out_local;
  longlong c;
  char *local_38;
  
  c = 0;
  lc = 0;
  runCount = 0;
  lVar2 = 1;
  out_local = out;
  local_38 = out;
  while( true ) {
    uVar1 = in[lVar2 + -1];
    if (ni <= lVar2) break;
    if (runCount < 0xff && uVar1 == in[lVar2]) {
      runCount = runCount + 1;
    }
    else {
      sendCode(hcode[uVar1],runCount,hcode[rlc],&c,&lc,&out_local);
      runCount = 0;
    }
    lVar2 = lVar2 + 1;
  }
  sendCode(hcode[uVar1],runCount,hcode[rlc],&c,&lc,&out_local);
  if (lc == 0) {
    lc = 0;
  }
  else {
    *out_local = (char)(c << (8U - (char)lc & 0x3f));
  }
  return lc + ((int)out_local - (int)local_38) * 8;
}

Assistant:

int hufEncode                   // return: output size (in bits)
    (const long long *hcode,    // i : encoding table
     const unsigned short *in,  // i : uncompressed input buffer
     const int ni,              // i : input buffer size (in bytes)
     int rlc,                   // i : rl code
     char *out)                 //  o: compressed output buffer
{
  char *outStart = out;
  long long c = 0;  // bits not yet written to out
  int lc = 0;       // number of valid bits in c (LSB)
  int s = in[0];
  int cs = 0;

  //
  // Loop on input values
  //

  for (int i = 1; i < ni; i++) {
    //
    // Count same values or send code
    //

    if (s == in[i] && cs < 255) {
      cs++;
    } else {
      sendCode(hcode[s], cs, hcode[rlc], c, lc, out);
      cs = 0;
    }

    s = in[i];
  }

  //
  // Send remaining code
  //

  sendCode(hcode[s], cs, hcode[rlc], c, lc, out);

  if (lc) *out = (c << (8 - lc)) & 0xff;

  return (out - outStart) * 8 + lc;
}